

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# select.c
# Opt level: O3

int Curl_socket_check(curl_socket_t readfd0,curl_socket_t readfd1,curl_socket_t writefd,
                     time_t timeout_ms)

{
  int iVar1;
  int *piVar2;
  timediff_t tVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  curltime cVar11;
  curltime newer;
  pollfd pfd [3];
  int local_5c;
  pollfd local_58 [4];
  time_t local_38;
  
  uVar9 = 0x7fffffff;
  if (timeout_ms < 0x7fffffff) {
    uVar9 = timeout_ms;
  }
  if ((readfd1 & readfd0 & writefd) == 0xffffffff) {
    iVar1 = Curl_wait_ms((int)uVar9);
    return iVar1;
  }
  if (timeout_ms < 1) {
    uVar8 = 0;
    local_5c = 0;
    local_38 = 0;
  }
  else {
    cVar11 = Curl_now();
    local_38 = cVar11.tv_sec;
    local_5c = cVar11.tv_usec;
    uVar8 = uVar9 & 0xffffffff;
  }
  bVar10 = readfd0 != -1;
  if (bVar10) {
    local_58[0].events = 0xc3;
    local_58[0].revents = 0;
    local_58[0].fd = readfd0;
  }
  uVar7 = (ulong)bVar10;
  if (readfd1 != -1) {
    local_58[uVar7].fd = readfd1;
    local_58[uVar7].events = 0xc3;
    local_58[uVar7].revents = 0;
    uVar7 = (ulong)(bVar10 + 1);
  }
  uVar6 = (uint)uVar7;
  if (writefd != -1) {
    local_58[uVar7].fd = writefd;
    local_58[uVar7].events = 0x104;
    local_58[uVar7].revents = 0;
    uVar6 = uVar6 + 1;
  }
  while( true ) {
    if (timeout_ms == 0) {
      uVar8 = 0;
    }
    if (timeout_ms < 0) {
      uVar8 = 0xffffffff;
    }
    iVar1 = poll(local_58,(ulong)uVar6,(int)uVar8);
    if (iVar1 != -1) break;
    piVar2 = __errno_location();
    iVar1 = *piVar2;
    if (iVar1 == 0) {
      if (timeout_ms < 1) {
        bVar10 = false;
        goto LAB_0012d91b;
      }
LAB_0012d8ea:
      cVar11 = Curl_now();
      newer._12_4_ = 0;
      newer.tv_sec = SUB128(cVar11._0_12_,0);
      newer.tv_usec = SUB124(cVar11._0_12_,8);
      cVar11.tv_usec = local_5c;
      cVar11.tv_sec = local_38;
      cVar11._12_4_ = 0;
      tVar3 = Curl_timediff(newer,cVar11);
      uVar4 = (int)uVar9 - (int)tVar3;
      uVar8 = (ulong)uVar4;
      bVar10 = (int)uVar4 < 1;
      iVar1 = -(uint)(0 < (int)uVar4);
    }
    else {
      bVar10 = iVar1 != 4 || Curl_ack_eintr != 0;
      if (0 < timeout_ms && (iVar1 == 4 && Curl_ack_eintr == 0)) goto LAB_0012d8ea;
LAB_0012d91b:
      iVar1 = -1;
    }
    if ((iVar1 != -1) || (bVar10)) break;
  }
  if (iVar1 < 0) {
    uVar6 = 0xffffffff;
  }
  else if (iVar1 == 0) {
    uVar6 = 0;
  }
  else {
    if (readfd0 == -1) {
      uVar6 = 0;
      uVar4 = 0;
    }
    else {
      bVar10 = (local_58[0]._4_4_ & 0x590000) != 0;
      uVar6 = bVar10 + 4;
      if ((local_58[0]._4_4_ & 0xa20000) == 0) {
        uVar6 = (uint)bVar10;
      }
      uVar4 = 1;
    }
    if (readfd1 != -1) {
      uVar5 = uVar6 + 8;
      if ((local_58[uVar4].revents & 0x59U) == 0) {
        uVar5 = uVar6;
      }
      uVar6 = uVar5 | 4;
      if ((local_58[uVar4].revents & 0xa2U) == 0) {
        uVar6 = uVar5;
      }
      uVar4 = uVar4 + 1;
    }
    if (writefd != -1) {
      uVar5 = uVar6 | 2;
      if ((local_58[uVar4].revents & 0x104U) == 0) {
        uVar5 = uVar6;
      }
      uVar6 = uVar5 | 4;
      if ((local_58[uVar4].revents & 0x38U) == 0) {
        uVar6 = uVar5;
      }
    }
  }
  return uVar6;
}

Assistant:

int Curl_socket_check(curl_socket_t readfd0, /* two sockets to read from */
                      curl_socket_t readfd1,
                      curl_socket_t writefd, /* socket to write to */
                      time_t timeout_ms)     /* milliseconds to wait */
{
#ifdef HAVE_POLL_FINE
  struct pollfd pfd[3];
  int num;
#else
  struct timeval pending_tv;
  struct timeval *ptimeout;
  fd_set fds_read;
  fd_set fds_write;
  fd_set fds_err;
  curl_socket_t maxfd;
#endif
  struct curltime initial_tv = {0, 0};
  int pending_ms = 0;
  int r;
  int ret;

#if SIZEOF_TIME_T != SIZEOF_INT
  /* wrap-around precaution */
  if(timeout_ms >= INT_MAX)
    timeout_ms = INT_MAX;
#endif

  if((readfd0 == CURL_SOCKET_BAD) && (readfd1 == CURL_SOCKET_BAD) &&
     (writefd == CURL_SOCKET_BAD)) {
    /* no sockets, just wait */
    r = Curl_wait_ms((int)timeout_ms);
    return r;
  }

  /* Avoid initial timestamp, avoid Curl_now() call, when elapsed
     time in this function does not need to be measured. This happens
     when function is called with a zero timeout or a negative timeout
     value indicating a blocking call should be performed. */

  if(timeout_ms > 0) {
    pending_ms = (int)timeout_ms;
    initial_tv = Curl_now();
  }

#ifdef HAVE_POLL_FINE

  num = 0;
  if(readfd0 != CURL_SOCKET_BAD) {
    pfd[num].fd = readfd0;
    pfd[num].events = POLLRDNORM|POLLIN|POLLRDBAND|POLLPRI;
    pfd[num].revents = 0;
    num++;
  }
  if(readfd1 != CURL_SOCKET_BAD) {
    pfd[num].fd = readfd1;
    pfd[num].events = POLLRDNORM|POLLIN|POLLRDBAND|POLLPRI;
    pfd[num].revents = 0;
    num++;
  }
  if(writefd != CURL_SOCKET_BAD) {
    pfd[num].fd = writefd;
    pfd[num].events = POLLWRNORM|POLLOUT;
    pfd[num].revents = 0;
    num++;
  }

  do {
    int error;
    if(timeout_ms < 0)
      pending_ms = -1;
    else if(!timeout_ms)
      pending_ms = 0;
    r = poll(pfd, num, pending_ms);
    if(r != -1)
      break;
    error = SOCKERRNO;
    if(error && ERROR_NOT_EINTR(error))
      break;
    if(timeout_ms > 0) {
      pending_ms = (int)(timeout_ms - ELAPSED_MS());
      if(pending_ms <= 0) {
        r = 0;  /* Simulate a "call timed out" case */
        break;
      }
    }
  } while(r == -1);

  if(r < 0)
    return -1;
  if(r == 0)
    return 0;

  ret = 0;
  num = 0;
  if(readfd0 != CURL_SOCKET_BAD) {
    if(pfd[num].revents & (POLLRDNORM|POLLIN|POLLERR|POLLHUP))
      ret |= CURL_CSELECT_IN;
    if(pfd[num].revents & (POLLRDBAND|POLLPRI|POLLNVAL))
      ret |= CURL_CSELECT_ERR;
    num++;
  }
  if(readfd1 != CURL_SOCKET_BAD) {
    if(pfd[num].revents & (POLLRDNORM|POLLIN|POLLERR|POLLHUP))
      ret |= CURL_CSELECT_IN2;
    if(pfd[num].revents & (POLLRDBAND|POLLPRI|POLLNVAL))
      ret |= CURL_CSELECT_ERR;
    num++;
  }
  if(writefd != CURL_SOCKET_BAD) {
    if(pfd[num].revents & (POLLWRNORM|POLLOUT))
      ret |= CURL_CSELECT_OUT;
    if(pfd[num].revents & (POLLERR|POLLHUP|POLLNVAL))
      ret |= CURL_CSELECT_ERR;
  }

  return ret;

#else  /* HAVE_POLL_FINE */

  FD_ZERO(&fds_err);
  maxfd = (curl_socket_t)-1;

  FD_ZERO(&fds_read);
  if(readfd0 != CURL_SOCKET_BAD) {
    VERIFY_SOCK(readfd0);
    FD_SET(readfd0, &fds_read);
    FD_SET(readfd0, &fds_err);
    maxfd = readfd0;
  }
  if(readfd1 != CURL_SOCKET_BAD) {
    VERIFY_SOCK(readfd1);
    FD_SET(readfd1, &fds_read);
    FD_SET(readfd1, &fds_err);
    if(readfd1 > maxfd)
      maxfd = readfd1;
  }

  FD_ZERO(&fds_write);
  if(writefd != CURL_SOCKET_BAD) {
    VERIFY_SOCK(writefd);
    FD_SET(writefd, &fds_write);
    FD_SET(writefd, &fds_err);
    if(writefd > maxfd)
      maxfd = writefd;
  }

  ptimeout = (timeout_ms < 0) ? NULL : &pending_tv;

  do {
    int error;
    if(timeout_ms > 0) {
      pending_tv.tv_sec = pending_ms / 1000;
      pending_tv.tv_usec = (pending_ms % 1000) * 1000;
    }
    else if(!timeout_ms) {
      pending_tv.tv_sec = 0;
      pending_tv.tv_usec = 0;
    }

    /* WinSock select() must not be called with an fd_set that contains zero
       fd flags, or it will return WSAEINVAL.  But, it also can't be called
       with no fd_sets at all!  From the documentation:

         Any two of the parameters, readfds, writefds, or exceptfds, can be
         given as null. At least one must be non-null, and any non-null
         descriptor set must contain at least one handle to a socket.

       We know that we have at least one bit set in at least two fd_sets in
       this case, but we may have no bits set in either fds_read or fd_write,
       so check for that and handle it.  Luckily, with WinSock, we can _also_
       ask how many bits are set on an fd_set.

       It is unclear why WinSock doesn't just handle this for us instead of
       calling this an error.

       Note also that WinSock ignores the first argument, so we don't worry
       about the fact that maxfd is computed incorrectly with WinSock (since
       curl_socket_t is unsigned in such cases and thus -1 is the largest
       value).
    */
#ifdef USE_WINSOCK
    r = select((int)maxfd + 1,
               fds_read.fd_count ? &fds_read : NULL,
               fds_write.fd_count ? &fds_write : NULL,
               &fds_err, ptimeout);
#else
    r = select((int)maxfd + 1, &fds_read, &fds_write, &fds_err, ptimeout);
#endif

    if(r != -1)
      break;
    error = SOCKERRNO;
    if(error && ERROR_NOT_EINTR(error))
      break;
    if(timeout_ms > 0) {
      pending_ms = (int)(timeout_ms - ELAPSED_MS());
      if(pending_ms <= 0) {
        r = 0;  /* Simulate a "call timed out" case */
        break;
      }
    }
  } while(r == -1);

  if(r < 0)
    return -1;
  if(r == 0)
    return 0;

  ret = 0;
  if(readfd0 != CURL_SOCKET_BAD) {
    if(FD_ISSET(readfd0, &fds_read))
      ret |= CURL_CSELECT_IN;
    if(FD_ISSET(readfd0, &fds_err))
      ret |= CURL_CSELECT_ERR;
  }
  if(readfd1 != CURL_SOCKET_BAD) {
    if(FD_ISSET(readfd1, &fds_read))
      ret |= CURL_CSELECT_IN2;
    if(FD_ISSET(readfd1, &fds_err))
      ret |= CURL_CSELECT_ERR;
  }
  if(writefd != CURL_SOCKET_BAD) {
    if(FD_ISSET(writefd, &fds_write))
      ret |= CURL_CSELECT_OUT;
    if(FD_ISSET(writefd, &fds_err))
      ret |= CURL_CSELECT_ERR;
  }

  return ret;

#endif  /* HAVE_POLL_FINE */

}